

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_pseudo_mididevice.cpp
# Opt level: O2

bool __thiscall SndSysMIDIDevice::Preprocess(SndSysMIDIDevice *this,MIDIStreamer *song,bool looping)

{
  int iVar1;
  MemoryArrayReader *this_00;
  undefined4 extraout_var;
  
  this_00 = (MemoryArrayReader *)operator_new(0x40);
  MemoryArrayReader::MemoryArrayReader(this_00,(char *)0x0,0);
  MIDIStreamer::CreateSMF(song,&this_00->buf,(uint)!looping);
  (this_00->super_FileReader).Length = (ulong)(this_00->buf).Count;
  (this->super_PseudoMIDIDevice).bLooping = looping;
  iVar1 = (*GSnd->_vptr_SoundRenderer[0xc])(GSnd,this_00,(ulong)looping << 4);
  (this->super_PseudoMIDIDevice).Stream = (SoundStream *)CONCAT44(extraout_var,iVar1);
  return false;
}

Assistant:

bool SndSysMIDIDevice::Preprocess(MIDIStreamer *song, bool looping)
{
    MemoryArrayReader *reader = new MemoryArrayReader(NULL, 0);
    song->CreateSMF(reader->GetArray(), looping ? 0 : 1);
    reader->UpdateLength();

    bLooping = looping;
    Stream = GSnd->OpenStream(reader, looping ? SoundStream::Loop : 0);
    return false;
}